

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split_string.h
# Opt level: O0

void SplitStringToIteratorUsing<std::__cxx11::string,back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *full,char *delim,
               back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *result)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RDX;
  char *in_RSI;
  char *in_RDI;
  bool bVar4;
  size_type end_index;
  size_type begin_index;
  char *start;
  char *end;
  char *p;
  char c;
  value_type *in_stack_fffffffffffffec8;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffed0;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d8;
  string local_d0 [32];
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b0;
  string local_a8 [32];
  long local_88;
  long local_80;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78 [3];
  allocator local_59;
  string local_58 [32];
  char *local_38;
  char *local_30;
  char *local_28;
  char local_19;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_18;
  char *local_10;
  char *local_8;
  
  local_18 = in_RDX;
  if ((*in_RSI == '\0') || (in_RSI[1] != '\0')) {
    local_10 = in_RSI;
    local_8 = in_RDI;
    local_80 = std::__cxx11::string::find_first_not_of(in_RDI,(ulong)in_RSI);
    while (local_80 != -1) {
      local_88 = std::__cxx11::string::find_first_of(local_8,(ulong)local_10);
      if (local_88 == -1) {
        std::__cxx11::string::substr((ulong)local_a8,(ulong)local_8);
        local_b0 = back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator++(local_18,0);
        back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*(&local_b0);
        back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator=(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        std::__cxx11::string::~string(local_a8);
        return;
      }
      std::__cxx11::string::substr((ulong)local_d0,(ulong)local_8);
      local_d8 = back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator++(local_18,0);
      in_stack_fffffffffffffed0 =
           back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&local_d8);
      back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator=(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      std::__cxx11::string::~string(local_d0);
      local_80 = std::__cxx11::string::find_first_not_of(local_8,(ulong)local_10);
    }
  }
  else {
    local_19 = *in_RSI;
    pcVar1 = (char *)std::__cxx11::string::data();
    local_28 = pcVar1;
    lVar2 = std::__cxx11::string::size();
    local_30 = pcVar1 + lVar2;
    while (pcVar1 = local_28, local_28 != local_30) {
      if (*local_28 == local_19) {
        local_28 = local_28 + 1;
      }
      else {
        local_38 = local_28;
        do {
          local_28 = local_28 + 1;
          bVar4 = false;
          if (local_28 != local_30) {
            bVar4 = *local_28 != local_19;
          }
        } while (bVar4);
        uVar3 = (long)local_28 - (long)pcVar1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_58,pcVar1,uVar3,&local_59);
        local_78[0] = back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator++(local_18,0);
        back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*(local_78);
        back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator=(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        std::__cxx11::string::~string(local_58);
        std::allocator<char>::~allocator((allocator<char> *)&local_59);
      }
    }
  }
  return;
}

Assistant:

static inline
void SplitStringToIteratorUsing(const StringType& full,
                                const char* delim,
                                ITR& result) {
  // Optimize the common case where delim is a single character.
  if (delim[0] != '\0' && delim[1] == '\0') {
    char c = delim[0];
    const char* p = full.data();
    const char* end = p + full.size();
    while (p != end) {
      if (*p == c) {
        ++p;
      } else {
        const char* start = p;
        while (++p != end && *p != c) {
          // Skip to the next occurrence of the delimiter.
        }
        *result++ = StringType(start, p - start);
      }
    }
    return;
  }

  std::string::size_type begin_index, end_index;
  begin_index = full.find_first_not_of(delim);
  while (begin_index != std::string::npos) {
    end_index = full.find_first_of(delim, begin_index);
    if (end_index == std::string::npos) {
      *result++ = full.substr(begin_index);
      return;
    }
    *result++ = full.substr(begin_index, (end_index - begin_index));
    begin_index = full.find_first_not_of(delim, end_index);
  }
}